

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O3

void PlaceEggDoodads(int LayerWidth,int LayerHeight,CTile *aOutTiles,CTile *aGameLayerTiles,
                    int ItemWidth,int ItemHeight,int *aImageTileID,int ImageTileIDCount,int Freq)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  CTile *pCVar12;
  CTile *pCVar13;
  uchar uVar14;
  int ix;
  int iVar15;
  ulong uVar16;
  CTile *pCVar17;
  int local_94;
  CTile *local_90;
  CTile *local_78;
  CTile *local_70;
  CTile *local_60;
  CTile *local_58;
  CTile *local_50;
  
  if (LayerHeight - ItemHeight != 0 && ItemHeight <= LayerHeight) {
    local_70 = aGameLayerTiles + LayerWidth;
    iVar6 = 0;
    uVar10 = 0;
    local_90 = aGameLayerTiles;
    local_78 = aOutTiles;
    do {
      if (0 < LayerWidth - ItemWidth) {
        local_50 = local_90;
        local_58 = local_78;
        local_60 = local_70;
        uVar7 = 0;
        local_94 = iVar6;
        do {
          if (ItemHeight < 1) {
LAB_0014bc50:
            uVar4 = rand();
            uVar5 = rand();
            if ((int)((long)(ulong)((uVar4 & 0x7fff) << 0x10 | uVar5 & 0xffff) % (long)Freq) == 0) {
              uVar4 = rand();
              uVar5 = rand();
              if (0 < ItemHeight) {
                uVar3 = (uchar)aImageTileID
                               [(long)(ulong)(uVar5 & 0xffff | (uVar4 & 0x7fff) << 0x10) %
                                (long)ImageTileIDCount & 0xffffffff];
                uVar9 = 0;
                iVar8 = local_94;
                do {
                  uVar16 = (ulong)(uint)ItemWidth;
                  uVar14 = uVar3;
                  iVar15 = iVar8;
                  if (0 < ItemWidth) {
                    do {
                      aOutTiles[iVar15].m_Index = uVar14;
                      uVar14 = uVar14 + '\x01';
                      iVar15 = iVar15 + 1;
                      uVar16 = uVar16 - 1;
                    } while (uVar16 != 0);
                  }
                  uVar9 = uVar9 + 1;
                  uVar3 = uVar3 + '\x10';
                  iVar8 = iVar8 + LayerWidth;
                } while (uVar9 != (uint)ItemHeight);
              }
            }
          }
          else {
            bVar2 = 1;
            uVar9 = 0;
            bVar11 = 0;
            bVar1 = 0;
            pCVar12 = local_50;
            pCVar13 = local_58;
            pCVar17 = local_60;
            do {
              if (0 < ItemWidth) {
                uVar16 = 0;
                do {
                  if (pCVar13[uVar16].m_Index != '\0') {
                    bVar11 = 1;
                    break;
                  }
                  if (pCVar12[uVar16].m_Index == '\x01') {
                    bVar1 = 1;
                    break;
                  }
                  if ((uVar9 == ItemHeight - 1) && (pCVar17[uVar16].m_Index != '\x01')) {
                    bVar2 = 0;
                    break;
                  }
                  uVar16 = uVar16 + 1;
                } while ((uint)ItemWidth != uVar16);
              }
              uVar9 = uVar9 + 1;
              pCVar17 = pCVar17 + LayerWidth;
              pCVar13 = pCVar13 + LayerWidth;
              pCVar12 = pCVar12 + LayerWidth;
            } while (uVar9 != (uint)ItemHeight);
            if (!(bool)(~bVar2 & 1) && !(bool)(bVar11 | bVar1)) goto LAB_0014bc50;
          }
          uVar7 = uVar7 + 1;
          local_60 = local_60 + 1;
          local_58 = local_58 + 1;
          local_50 = local_50 + 1;
          local_94 = local_94 + 1;
        } while (uVar7 != (uint)(LayerWidth - ItemWidth));
      }
      uVar10 = uVar10 + 1;
      local_70 = local_70 + LayerWidth;
      local_78 = local_78 + LayerWidth;
      local_90 = local_90 + LayerWidth;
      iVar6 = iVar6 + LayerWidth;
    } while (uVar10 != (uint)(LayerHeight - ItemHeight));
  }
  return;
}

Assistant:

static void PlaceEggDoodads(int LayerWidth, int LayerHeight, CTile* aOutTiles, CTile* aGameLayerTiles, int ItemWidth, int ItemHeight, const int* aImageTileID, int ImageTileIDCount, int Freq)
{
	for(int y = 0; y < LayerHeight-ItemHeight; y++)
	{
		for(int x = 0; x < LayerWidth-ItemWidth; x++)
		{
			bool Overlap = false;
			bool ObstructedByWall = false;
			bool HasGround = true;

			for(int iy = 0; iy < ItemHeight; iy++)
			{
				for(int ix = 0; ix < ItemWidth; ix++)
				{
					int Tid = (y+iy) * LayerWidth + (x+ix);
					int DownTid = (y+iy+1) * LayerWidth + (x+ix);

					if(aOutTiles[Tid].m_Index != 0)
					{
						Overlap = true;
						break;
					}

					if(aGameLayerTiles[Tid].m_Index == 1)
					{
						ObstructedByWall = true;
						break;
					}

					if(iy == ItemHeight-1 && aGameLayerTiles[DownTid].m_Index != 1)
					{
						HasGround = false;
						break;
					}
				}
			}

			if(!Overlap && !ObstructedByWall && HasGround && random_int()%Freq == 0)
			{
				const int BaskerStartID = aImageTileID[random_int()%ImageTileIDCount];

				for(int iy = 0; iy < ItemHeight; iy++)
				{
					for(int ix = 0; ix < ItemWidth; ix++)
					{
						int Tid = (y+iy) * LayerWidth + (x+ix);
						aOutTiles[Tid].m_Index = BaskerStartID + iy * 16 + ix;
					}
				}
			}
		}
	}
}